

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall wabt::anon_unknown_78::BinaryReaderIR::OnEndExpr(BinaryReaderIR *this)

{
  Expr *pEVar1;
  pointer pLVar2;
  Result RVar3;
  size_t sVar4;
  _func_int **pp_Var5;
  char *pcVar6;
  bool bVar7;
  Expr *expr;
  LabelNode *label;
  Expr *local_38;
  LabelNode *local_30;
  
  RVar3 = TopLabelExpr(this,&local_30,&local_38);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  switch(local_30->label_type) {
  case Block:
    if (local_38->type_ != Block) {
      pcVar6 = 
      "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
      ;
      goto LAB_0014c9f9;
    }
    break;
  case Loop:
    if (local_38->type_ != Loop) {
      pcVar6 = 
      "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
      ;
      goto LAB_0014c9f9;
    }
    break;
  case If:
    if (local_38->type_ != If) {
LAB_0014c9cd:
      pcVar6 = "Derived *wabt::cast(Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
LAB_0014c9f9:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/cast.h"
                    ,0x4e,pcVar6);
    }
    break;
  case Else:
    if (local_38->type_ != If) goto LAB_0014c9cd;
    pcVar6 = this->filename_;
    pp_Var5 = (_func_int **)((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset
    ;
    sVar4 = strlen(pcVar6);
    *(char **)((long)&local_38[4].loc.field_1 + 8) = pcVar6;
    *(size_t *)&local_38[4].type_ = sVar4;
    local_38[5]._vptr_Expr = pp_Var5;
    local_38 = local_38 + 5;
    goto LAB_0014c98e;
  case Try:
    if (local_38->type_ != Try) {
      pcVar6 = "Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]";
      goto LAB_0014c9f9;
    }
    break;
  default:
    goto switchD_0014c89f_default;
  }
  pcVar6 = this->filename_;
  pEVar1 = (Expr *)((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  pp_Var5 = (_func_int **)strlen(pcVar6);
  *(char **)&local_38[3].type_ = pcVar6;
  local_38[4]._vptr_Expr = pp_Var5;
  local_38[4].super_intrusive_list_base<wabt::Expr>.next_ = pEVar1;
  local_38 = (Expr *)&local_38[4].super_intrusive_list_base<wabt::Expr>;
LAB_0014c98e:
  (local_38->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
switchD_0014c89f_default:
  pLVar2 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = pLVar2 == (this->label_stack_).
                    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  if (bVar7) {
    PrintError(this,"popping empty label stack");
  }
  else {
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar2 + -1;
  }
  return (Result)(uint)bVar7;
}

Assistant:

Result BinaryReaderIR::OnEndExpr() {
  LabelNode* label;
  Expr* expr;
  CHECK_RESULT(TopLabelExpr(&label, &expr));
  switch (label->label_type) {
    case LabelType::Block:
      cast<BlockExpr>(expr)->block.end_loc = GetLocation();
      break;
    case LabelType::Loop:
      cast<LoopExpr>(expr)->block.end_loc = GetLocation();
      break;
    case LabelType::If:
      cast<IfExpr>(expr)->true_.end_loc = GetLocation();
      break;
    case LabelType::Else:
      cast<IfExpr>(expr)->false_end_loc = GetLocation();
      break;
    case LabelType::Try:
      cast<TryExpr>(expr)->block.end_loc = GetLocation();
      break;

    case LabelType::Func:
    case LabelType::Catch:
      break;
  }

  return PopLabel();
}